

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_ToIndex(JSContext *ctx,uint64_t *plen,JSValue val)

{
  int iVar1;
  int iVar2;
  JSValueUnion JVar3;
  int64_t v;
  JSValueUnion local_20;
  
  local_20 = val.u;
  if (0xfffffff4 < (uint)val.tag) {
    *(int *)local_20.ptr = *local_20.ptr + 1;
  }
  iVar1 = JS_ToInt64SatFree(ctx,(int64_t *)&local_20.int32,val);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar2 = 0;
    JVar3 = local_20;
    if ((ulong)local_20.ptr >> 0x35 != 0) {
      JVar3.float64 = 0.0;
      JS_ThrowRangeError(ctx,"invalid array index");
      iVar2 = -1;
    }
    *plen = (uint64_t)JVar3;
  }
  return iVar2;
}

Assistant:

int JS_ToIndex(JSContext *ctx, uint64_t *plen, JSValueConst val)
{
    int64_t v;
    if (JS_ToInt64Sat(ctx, &v, val))
        return -1;
    if (v < 0 || v > MAX_SAFE_INTEGER) {
        JS_ThrowRangeError(ctx, "invalid array index");
        *plen = 0;
        return -1;
    }
    *plen = v;
    return 0;
}